

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_ring_lines(rf_vec2 center,float inner_radius,float outer_radius,int start_angle,
                       int end_angle,int segments,rf_color color)

{
  _Bool _Var1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long local_50;
  rf_int i;
  int limit;
  _Bool show_cap_lines;
  float angle;
  float step_length;
  float th;
  float CIRCLE_ERROR_RATE;
  int tmp_1;
  float tmp;
  int segments_local;
  int end_angle_local;
  int start_angle_local;
  float outer_radius_local;
  float inner_radius_local;
  rf_color color_local;
  rf_vec2 center_local;
  
  if (start_angle != end_angle) {
    end_angle_local = (int)outer_radius;
    start_angle_local = (int)inner_radius;
    if ((outer_radius < inner_radius) &&
       (end_angle_local = (int)inner_radius, start_angle_local = (int)outer_radius,
       inner_radius <= 0.0)) {
      end_angle_local = 0x3dcccccd;
    }
    tmp = (float)end_angle;
    segments_local = start_angle;
    if (end_angle < start_angle) {
      tmp = (float)start_angle;
      segments_local = end_angle;
    }
    tmp_1 = segments;
    if (segments < 4) {
      fVar3 = powf(1.0 - 0.5 / (float)end_angle_local,2.0);
      fVar3 = acosf(fVar3 + fVar3 + -1.0);
      fVar3 = ceilf(6.2831855 / fVar3);
      tmp_1 = (int)(((float)((int)tmp - segments_local) * fVar3) / 360.0);
      if (tmp_1 < 1) {
        tmp_1 = 4;
      }
    }
    if (0.0 < (float)start_angle_local) {
      fVar3 = (float)((int)tmp - segments_local) / (float)tmp_1;
      limit = (int)(float)segments_local;
      i._0_4_ = (tmp_1 + 1) * 4;
      bVar2 = ((int)tmp - segments_local) % 0x168 == 0;
      if (bVar2) {
        i._0_4_ = tmp_1 << 2;
      }
      i._7_1_ = !bVar2;
      _Var1 = rf_gfx_check_buffer_limit((int)i);
      if (_Var1) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_LINES);
      outer_radius_local._0_1_ = color.r;
      outer_radius_local._1_1_ = color.g;
      outer_radius_local._2_1_ = color.b;
      outer_radius_local._3_1_ = color.a;
      inner_radius_local = center.x;
      color_local = (rf_color)center.y;
      if (i._7_1_) {
        rf_gfx_color4ub(outer_radius_local._0_1_,outer_radius_local._1_1_,outer_radius_local._2_1_,
                        outer_radius_local._3_1_);
        fVar4 = sinf((float)limit * 0.017453292);
        fVar5 = cosf((float)limit * 0.017453292);
        rf_gfx_vertex2f(fVar4 * (float)end_angle_local + inner_radius_local,
                        fVar5 * (float)end_angle_local + (float)color_local);
        fVar4 = sinf((float)limit * 0.017453292);
        fVar5 = cosf((float)limit * 0.017453292);
        rf_gfx_vertex2f(fVar4 * (float)start_angle_local + inner_radius_local,
                        fVar5 * (float)start_angle_local + (float)color_local);
      }
      for (local_50 = 0; local_50 < tmp_1; local_50 = local_50 + 1) {
        rf_gfx_color4ub(outer_radius_local._0_1_,outer_radius_local._1_1_,outer_radius_local._2_1_,
                        outer_radius_local._3_1_);
        fVar4 = sinf((float)limit * 0.017453292);
        fVar5 = cosf((float)limit * 0.017453292);
        rf_gfx_vertex2f(fVar4 * (float)end_angle_local + inner_radius_local,
                        fVar5 * (float)end_angle_local + (float)color_local);
        fVar4 = sinf(((float)limit + fVar3) * 0.017453292);
        fVar5 = cosf(((float)limit + fVar3) * 0.017453292);
        rf_gfx_vertex2f(fVar4 * (float)end_angle_local + inner_radius_local,
                        fVar5 * (float)end_angle_local + (float)color_local);
        fVar4 = sinf((float)limit * 0.017453292);
        fVar5 = cosf((float)limit * 0.017453292);
        rf_gfx_vertex2f(fVar4 * (float)start_angle_local + inner_radius_local,
                        fVar5 * (float)start_angle_local + (float)color_local);
        fVar4 = sinf(((float)limit + fVar3) * 0.017453292);
        fVar5 = cosf(((float)limit + fVar3) * 0.017453292);
        rf_gfx_vertex2f(fVar4 * (float)start_angle_local + inner_radius_local,
                        fVar5 * (float)start_angle_local + (float)color_local);
        limit = (int)(fVar3 + (float)limit);
      }
      if (i._7_1_) {
        rf_gfx_color4ub(outer_radius_local._0_1_,outer_radius_local._1_1_,outer_radius_local._2_1_,
                        outer_radius_local._3_1_);
        fVar3 = sinf((float)limit * 0.017453292);
        fVar4 = cosf((float)limit * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)end_angle_local + inner_radius_local,
                        fVar4 * (float)end_angle_local + (float)color_local);
        fVar3 = sinf((float)limit * 0.017453292);
        fVar4 = cosf((float)limit * 0.017453292);
        rf_gfx_vertex2f(fVar3 * (float)start_angle_local + inner_radius_local,
                        fVar4 * (float)start_angle_local + (float)color_local);
      }
      rf_gfx_end();
    }
    else {
      rf_draw_circle_sector_lines(center,(float)end_angle_local,segments_local,(int)tmp,tmp_1,color)
      ;
    }
  }
  return;
}

Assistant:

RF_API void rf_draw_ring_lines(rf_vec2 center, float inner_radius, float outer_radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (start_angle == end_angle) return;

    // Function expects (outerRadius > innerRadius)
    if (outer_radius < inner_radius)
    {
        float tmp = outer_radius;
        outer_radius = inner_radius;
        inner_radius = tmp;

        if (outer_radius <= 0.0f) outer_radius = 0.1f;
    }

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/outer_radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    if (inner_radius <= 0.0f)
    {
        rf_draw_circle_sector_lines(center, outer_radius, start_angle, end_angle, segments, color);
        return;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;

    bool show_cap_lines = true;
    int limit = 4 * (segments + 1);
    if ((end_angle - start_angle)%360 == 0) { limit = 4 * segments; show_cap_lines = false; }

    if (rf_gfx_check_buffer_limit(limit)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
    }

    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

        angle += step_length;
    }

    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
    }
    rf_gfx_end();
}